

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp rapidjson::internal::GetCachedPower(int e,int *K)

{
  uint uVar1;
  double dVar2;
  DiyFp DVar3;
  DiyFp DVar4;
  undefined4 local_34;
  uint index;
  int k;
  double dk;
  int *K_local;
  int e_local;
  
  dVar2 = (double)(-0x3d - e) * 0.30102999566398114 + 347.0;
  local_34 = (int)dVar2;
  if (0.0 < dVar2 - (double)local_34) {
    local_34 = local_34 + 1;
  }
  uVar1 = (local_34 >> 3) + 1;
  *K = uVar1 * -8 + 0x15c;
  DVar3 = GetCachedPowerByIndex((ulong)uVar1);
  DVar4._12_4_ = 0;
  DVar4.f = SUB128(DVar3._0_12_,0);
  DVar4.e = SUB124(DVar3._0_12_,8);
  return DVar4;
}

Assistant:

inline DiyFp GetCachedPower(int e, int* K) {

    //int k = static_cast<int>(ceil((-61 - e) * 0.30102999566398114)) + 374;
    double dk = (-61 - e) * 0.30102999566398114 + 347;  // dk must be positive, so can do ceiling in positive
    int k = static_cast<int>(dk);
    if (dk - k > 0.0)
        k++;

    unsigned index = static_cast<unsigned>((k >> 3) + 1);
    *K = -(-348 + static_cast<int>(index << 3));    // decimal exponent no need lookup table

    return GetCachedPowerByIndex(index);
}